

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  TGAImage image;
  TGAImage local_58;
  string local_30;
  
  TGAImage::TGAImage(&local_58,300,300,3);
  line_attempt_5(-100,-100,500,500,&local_58,(TGAColor)0x4ffffffff);
  line_attempt_5(0x28,0x28,0x3c,0x104,&local_58,(TGAColor)0x4ffffffff);
  line_attempt_5(0x28,0x28,0x104,0x3c,&local_58,(TGAColor)0x4ffffffff);
  TGAImage::flip_vertically(&local_58);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"output.tga","");
  TGAImage::write_tga_file(&local_58,&local_30,true,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_58.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
    TGAImage image(300, 300, TGAImage::RGB);

    line_attempt_5(-100, -100, 500, 500, image, white);
    line_attempt_5(40, 40, 60, 260, image, white);
    line_attempt_5(40, 40, 260, 60, image, white);

    image.flip_vertically();  // i want to have the origin at the left bottom corner of the image
    image.write_tga_file("output.tga");
    return 0;
}